

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O2

CharString * __thiscall icu_63::CharString::append(CharString *this,char c,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  
  UVar2 = ensureCapacity(this,this->len + 2,0,errorCode);
  if (UVar2 != '\0') {
    iVar1 = this->len;
    this->len = iVar1 + 1;
    (this->buffer).ptr[iVar1] = c;
    (this->buffer).ptr[this->len] = '\0';
  }
  return this;
}

Assistant:

CharString &CharString::append(char c, UErrorCode &errorCode) {
    if(ensureCapacity(len+2, 0, errorCode)) {
        buffer[len++]=c;
        buffer[len]=0;
    }
    return *this;
}